

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O2

void adios2::core::engine::ssc::DeserializeVariable
               (Buffer *input,ShapeID shapeId,uint64_t *pos,BlockInfo *b,IO *io,bool regIO,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
               *StructDefs)

{
  Dims *this;
  uint64_t uVar1;
  pointer *ppuVar2;
  byte bVar3;
  uint8_t *puVar4;
  Variable *pVVar5;
  long lVar6;
  iterator iVar7;
  uint64_t uVar8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  ulong uVar9;
  size_t __n;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  string local_138;
  string local_118;
  vector<char,_std::allocator<char>_> structDefChar;
  Dims vStart;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Dims *local_90;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  Dims vShape_15;
  Dims vStart_15;
  vector<char,_std::allocator<char>_> name;
  
  b->shapeId = shapeId;
  uVar9 = (ulong)input->m_Buffer[*pos];
  *pos = *pos + 1;
  std::vector<char,_std::allocator<char>_>::vector(&name,uVar9,(allocator_type *)&vStart);
  memcpy(name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,input->m_Buffer + *pos,uVar9);
  ppuVar2 = &vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)&vStart,
             name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::__cxx11::string::operator=((string *)b,(string *)&vStart);
  std::__cxx11::string::~string((string *)&vStart);
  uVar8 = *pos;
  uVar1 = uVar8 + uVar9;
  *pos = uVar1;
  puVar4 = input->m_Buffer;
  bVar3 = puVar4[uVar1];
  b->type = (uint)bVar3;
  uVar8 = uVar8 + uVar9 + 1;
  *pos = uVar8;
  if (bVar3 == Struct) {
    uVar9 = (ulong)puVar4[uVar1 + 1];
    *pos = uVar1 + 2;
    std::vector<char,_std::allocator<char>_>::vector(&structDefChar,uVar9,(allocator_type *)&vStart)
    ;
    memcpy(structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,input->m_Buffer + *pos,uVar9);
    *pos = *pos + uVar9;
    vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)&vStart,
               structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__cxx11::string::operator=((string *)&b->structDef,(string *)&vStart);
    std::__cxx11::string::~string((string *)&vStart);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&structDefChar.super__Vector_base<char,_std::allocator<char>_>);
    uVar8 = *pos;
    puVar4 = input->m_Buffer;
  }
  b->elementSize = *(size_t *)(puVar4 + uVar8);
  uVar1 = *pos;
  *pos = uVar1 + 8;
  bVar3 = puVar4[uVar1 + 8];
  uVar9 = (ulong)bVar3;
  *pos = uVar1 + 9;
  this = &b->shape;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this,uVar9);
  local_90 = &b->start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_90,uVar9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&b->count,uVar9);
  __n = (ulong)bVar3 * 8;
  memcpy((b->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,input->m_Buffer + *pos,__n);
  uVar1 = *pos;
  *pos = uVar1 + __n;
  memcpy((b->start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,input->m_Buffer + uVar1 + __n,__n);
  uVar1 = *pos;
  *pos = uVar1 + __n;
  memcpy((b->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,input->m_Buffer + uVar1 + __n,__n);
  uVar1 = *pos;
  *pos = __n + uVar1;
  puVar4 = input->m_Buffer;
  b->bufferStart = *(size_t *)(puVar4 + __n + uVar1);
  uVar1 = *pos;
  *pos = uVar1 + 8;
  b->bufferCount = *(size_t *)(puVar4 + uVar1 + 8);
  uVar1 = *pos;
  *pos = uVar1 + 8;
  uVar9 = (ulong)puVar4[uVar1 + 8];
  *pos = uVar1 + 9;
  std::vector<char,_std::allocator<char>_>::resize(&b->value,uVar9);
  if (uVar9 != 0) {
    memcpy((b->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,input->m_Buffer + *pos,uVar9);
    *pos = *pos + uVar9;
  }
  if (!regIO) goto LAB_0013de35;
  switch(b->type) {
  case Int8:
    pVVar5 = adios2::core::IO::InquireVariable<signed_char>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    break;
  case Int16:
    pVVar5 = adios2::core::IO::InquireVariable<short>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<short>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<short>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_08._M_len = 1;
      __l_08._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_08,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<short>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<short>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case Int32:
    pVVar5 = adios2::core::IO::InquireVariable<int>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<int>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<int>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_04,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<int>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<int>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case Int64:
    pVVar5 = adios2::core::IO::InquireVariable<long>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<long>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<long>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_05._M_len = 1;
      __l_05._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_05,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<long>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<long>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case UInt8:
    pVVar5 = adios2::core::IO::InquireVariable<unsigned_char>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_char>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<unsigned_char>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_01,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_char>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_char>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case UInt16:
    pVVar5 = adios2::core::IO::InquireVariable<unsigned_short>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_short>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<unsigned_short>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_09._M_len = 1;
      __l_09._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_09,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_short>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_short>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case UInt32:
    pVVar5 = adios2::core::IO::InquireVariable<unsigned_int>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_int>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<unsigned_int>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_11._M_len = 1;
      __l_11._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_11,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_int>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_int>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case UInt64:
    pVVar5 = adios2::core::IO::InquireVariable<unsigned_long>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_long>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<unsigned_long>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_06._M_len = 1;
      __l_06._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_06,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_long>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<unsigned_long>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case Float:
    pVVar5 = adios2::core::IO::InquireVariable<float>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<float>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<float>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_13._M_len = 1;
      __l_13._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_13,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<float>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<float>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case Double:
    pVVar5 = adios2::core::IO::InquireVariable<double>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<double>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<double>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_03,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<double>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<double>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case LongDouble:
    pVVar5 = adios2::core::IO::InquireVariable<long_double>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<long_double>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<long_double>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_12._M_len = 1;
      __l_12._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_12,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<long_double>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<long_double>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case FloatComplex:
    pVVar5 = adios2::core::IO::InquireVariable<std::complex<float>>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<std::complex<float>>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<std::complex<float>>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_00,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<std::complex<float>>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<std::complex<float>>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case DoubleComplex:
    pVVar5 = adios2::core::IO::InquireVariable<std::complex<double>>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<std::complex<double>>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<std::complex<double>>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_02,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<std::complex<double>>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<std::complex<double>>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case String:
    pVVar5 = adios2::core::IO::InquireVariable<std::__cxx11::string>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<std::__cxx11::string>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<std::__cxx11::string>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_10._M_len = 1;
      __l_10._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_10,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<std::__cxx11::string>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<std::__cxx11::string>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case Char:
    pVVar5 = adios2::core::IO::InquireVariable<char>((string *)io);
    if (pVVar5 != (Variable *)0x0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 structDefChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    switch(b->shapeId) {
    case GlobalValue:
      local_138.field_2._M_allocated_capacity = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<char>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case GlobalArray:
      adios2::core::IO::DefineVariable<char>
                ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
                 SUB81((vector *)&structDefChar,0));
      break;
    case LocalValue:
      vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l._M_len = 1;
      __l._M_array = (iterator)&vStart_15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l,
                 (allocator_type *)&vShape_15);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<char>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&local_b8,0));
      goto LAB_0013de00;
    case LocalArray:
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      adios2::core::IO::DefineVariable<char>
                ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
                 SUB81(&structDefChar,0));
      goto LAB_0013de0d;
    }
    goto switchD_0013cb2b_caseD_3;
  case Struct:
    lVar6 = adios2::core::IO::InquireStructVariable((string *)io);
    if (lVar6 != 0) goto LAB_0013de35;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vStart_15,local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&vShape_15,this);
    if (*(int *)(io + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (vShape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 vShape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
    }
    if (b->shapeId == GlobalArray) {
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&StructDefs->_M_h,&b->structDef);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__cxx11::string::string((string *)&vStart,"Engine",&local_83);
        std::__cxx11::string::string((string *)&structDefChar,"SscHelper",&local_81);
        std::__cxx11::string::string((string *)&local_138,"DeserializeVariable",&local_82);
        std::operator+(&local_b8,"struct type ",&b->structDef);
        std::operator+(&local_118,&local_b8," not defined");
        helper::Throw<std::runtime_error>
                  ((string *)&vStart,(string *)&structDefChar,&local_138,&local_118,-1);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&structDefChar);
        std::__cxx11::string::~string((string *)&vStart);
      }
      else {
        adios2::core::IO::DefineStructVariable
                  ((string *)io,(StructDefinition *)b,
                   (vector *)
                   ((long)iVar7.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_true>
                          ._M_cur + 0x28),(vector *)&vShape_15,(vector *)&vStart_15,
                   SUB81((vector *)&vShape_15,0));
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&vShape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    this_00 = &vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    goto LAB_0013de30;
  default:
    std::__cxx11::string::string((string *)&vStart,"Engine",(allocator *)&local_b8);
    std::__cxx11::string::string((string *)&structDefChar,"SscHelper",(allocator *)&vStart_15);
    std::__cxx11::string::string((string *)&local_138,"DeserializeVariable",(allocator *)&vShape_15)
    ;
    std::__cxx11::string::string((string *)&local_118,"unknown variable data type",&local_83);
    helper::Throw<std::runtime_error>
              ((string *)&vStart,(string *)&structDefChar,&local_138,&local_118,-1);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&structDefChar);
    std::__cxx11::string::~string((string *)&vStart);
    goto LAB_0013de35;
  }
  switch(b->shapeId) {
  case GlobalValue:
    local_138.field_2._M_allocated_capacity = 0;
    local_138._M_dataplus._M_p = (pointer)0x0;
    local_138._M_string_length = 0;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = 0;
    adios2::core::IO::DefineVariable<signed_char>
              ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,SUB81(&local_b8,0)
              );
    goto LAB_0013de00;
  case GlobalArray:
    adios2::core::IO::DefineVariable<signed_char>
              ((string *)io,(vector *)b,(vector *)&structDefChar,(vector *)&vStart,
               SUB81((vector *)&structDefChar,0));
    break;
  case LocalValue:
    vStart_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
    __l_07._M_len = 1;
    __l_07._M_array = (iterator)&vStart_15;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138,__l_07,
               (allocator_type *)&vShape_15);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = 0;
    adios2::core::IO::DefineVariable<signed_char>
              ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,SUB81(&local_b8,0)
              );
LAB_0013de00:
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
LAB_0013de0d:
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_118);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138);
    break;
  case LocalArray:
    local_138._M_dataplus._M_p = (pointer)0x0;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity = 0;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    adios2::core::IO::DefineVariable<signed_char>
              ((string *)io,(vector *)b,(vector *)&local_138,(vector *)&local_118,
               SUB81(&structDefChar,0));
    goto LAB_0013de0d;
  }
switchD_0013cb2b_caseD_3:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&structDefChar);
  this_00 = &vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
LAB_0013de30:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(this_00);
LAB_0013de35:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&name.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void DeserializeVariable(const Buffer &input, const ShapeID shapeId, uint64_t &pos, BlockInfo &b,
                         IO &io, const bool regIO,
                         std::unordered_map<std::string, StructDefinition> &StructDefs)
{
    b.shapeId = static_cast<ShapeID>(shapeId);

    uint8_t nameSize = input[pos];
    ++pos;

    std::vector<char> name(nameSize);
    std::memcpy(name.data(), input.data(pos), nameSize);
    b.name = std::string(name.begin(), name.end());
    pos += nameSize;

    b.type = static_cast<DataType>(input[pos]);
    ++pos;

    if (b.type == DataType::Struct)
    {
        uint8_t structDefSize = input.value<uint8_t>(pos);
        ++pos;
        std::vector<char> structDefChar(structDefSize);
        std::memcpy(structDefChar.data(), input.data(pos), structDefSize);
        pos += structDefSize;
        b.structDef = std::string(structDefChar.begin(), structDefChar.end());
    }

    b.elementSize = input.value<uint64_t>(pos);
    pos += 8;

    uint8_t shapeSize = input[pos];
    ++pos;
    b.shape.resize(shapeSize);
    b.start.resize(shapeSize);
    b.count.resize(shapeSize);

    std::memcpy(b.shape.data(), input.data(pos), 8 * shapeSize);
    pos += 8 * shapeSize;

    std::memcpy(b.start.data(), input.data(pos), 8 * shapeSize);
    pos += 8 * shapeSize;

    std::memcpy(b.count.data(), input.data(pos), 8 * shapeSize);
    pos += 8 * shapeSize;

    b.bufferStart = input.value<uint64_t>(pos);
    pos += 8;

    b.bufferCount = input.value<uint64_t>(pos);
    pos += 8;

    uint8_t valueSize = input[pos];
    pos++;
    b.value.resize(valueSize);
    if (valueSize > 0)
    {
        std::memcpy(b.value.data(), input.data() + pos, valueSize);
        pos += valueSize;
    }

    if (regIO)
    {
        if (b.type == DataType::Struct)
        {
            auto v = io.InquireStructVariable(b.name);
            if (!v)
            {
                Dims vStart = b.start;
                Dims vShape = b.shape;
                if (io.m_ArrayOrder != ArrayOrdering::RowMajor)
                {
                    std::reverse(vStart.begin(), vStart.end());
                    std::reverse(vShape.begin(), vShape.end());
                }
                if (b.shapeId == ShapeID::GlobalArray)
                {
                    StructDefinition *def = nullptr;
                    auto it = StructDefs.find(b.structDef);
                    if (it != StructDefs.end())
                    {
                        def = &it->second;
                    }
                    if (def == nullptr)
                    {
                        helper::Throw<std::runtime_error>(
                            "Engine", "SscHelper", "DeserializeVariable",
                            "struct type " + b.structDef + " not defined");
                    }
                    else
                    {
                        io.DefineStructVariable(b.name, *def, vShape, vStart, vShape);
                    }
                }
            }
        }
#define declare_type(T)                                                                            \
    else if (b.type == helper::GetDataType<T>())                                                   \
    {                                                                                              \
        auto v = io.InquireVariable<T>(b.name);                                                    \
        if (!v)                                                                                    \
        {                                                                                          \
            Dims vStart = b.start;                                                                 \
            Dims vShape = b.shape;                                                                 \
            if (io.m_ArrayOrder != ArrayOrdering::RowMajor)                                        \
            {                                                                                      \
                std::reverse(vStart.begin(), vStart.end());                                        \
                std::reverse(vShape.begin(), vShape.end());                                        \
            }                                                                                      \
            if (b.shapeId == ShapeID::GlobalValue)                                                 \
            {                                                                                      \
                io.DefineVariable<T>(b.name);                                                      \
            }                                                                                      \
            else if (b.shapeId == ShapeID::GlobalArray)                                            \
            {                                                                                      \
                io.DefineVariable<T>(b.name, vShape, vStart, vShape);                              \
            }                                                                                      \
            else if (b.shapeId == ShapeID::LocalValue)                                             \
            {                                                                                      \
                io.DefineVariable<T>(b.name, {adios2::LocalValueDim});                             \
            }                                                                                      \
            else if (b.shapeId == ShapeID::LocalArray)                                             \
            {                                                                                      \
                io.DefineVariable<T>(b.name, {}, {}, vShape);                                      \
            }                                                                                      \
        }                                                                                          \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        else
        {
            helper::Throw<std::runtime_error>("Engine", "SscHelper", "DeserializeVariable",
                                              "unknown variable data type");
        }
    }